

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  
  pcVar1 = this->alloc_ptr_;
  uVar3 = (ulong)((uint)pcVar1 & 7);
  lVar2 = 8 - uVar3;
  if (uVar3 == 0) {
    lVar2 = 0;
  }
  uVar3 = lVar2 + bytes;
  if (uVar3 <= this->alloc_bytes_remaining_) {
    this->alloc_ptr_ = pcVar1 + uVar3;
    this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - uVar3;
    return pcVar1 + lVar2;
  }
  if (0x400 < bytes) {
    pcVar1 = AllocateNewBlock(this,bytes);
    return pcVar1;
  }
  pcVar1 = AllocateNewBlock(this,0x1000);
  this->alloc_ptr_ = pcVar1 + bytes;
  this->alloc_bytes_remaining_ = 0x1000 - bytes;
  return pcVar1;
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}